

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O3

double __thiscall Model::schoenberg_kernel(Model *this,int contextId,int centerId,double sigma)

{
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  
  uVar6 = (ulong)this->dim_size;
  pvVar4 = operator_new__(uVar6 * 8);
  dVar7 = 1.0;
  if (uVar6 != 0) {
    pdVar2 = this->emb1[contextId];
    pdVar3 = this->emb0[centerId];
    uVar5 = 0;
    do {
      *(double *)((long)pvVar4 + uVar5 * 8) = pdVar2[uVar5] - pdVar3[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar6 != uVar5);
    dVar7 = 1.0;
    if (uVar6 != 0) {
      dVar7 = 0.0;
      uVar5 = 0;
      do {
        dVar1 = *(double *)((long)pvVar4 + uVar5 * 8);
        dVar7 = dVar7 + dVar1 * dVar1;
        uVar5 = uVar5 + 1;
      } while (uVar6 != uVar5);
      dVar7 = dVar7 + 1.0;
    }
  }
  operator_delete__(pvVar4);
  dVar7 = pow(1.0 / dVar7,sigma);
  return dVar7;
}

Assistant:

double Model::schoenberg_kernel(int contextId, int centerId, double sigma) {

    double inv, sum;
    auto *diff = new double[this->dim_size];

    for (int d = 0; d < this->dim_size; d++)
        diff[d] = this->emb1[contextId][d] - this->emb0[centerId][d];

    sum = 0.0;
    for(int d = 0; d < this->dim_size; d++)
        sum += diff[d] * diff[d];
    inv = 1.0 / ( 1.0 + sum );

    delete [] diff;

    return pow(inv, sigma);
}